

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

void __thiscall
Minisat::Int64Option::getNonDefaultString
          (Int64Option *this,int granularity,char *buffer,size_t size)

{
  vector<long,_std::allocator<long>_> *pvVar1;
  char *__s;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  size_t sVar5;
  vector<long,_std::allocator<long>_> *in_RCX;
  char *in_RDX;
  int in_ESI;
  long in_RDI;
  int sl_1;
  int64_t i_1;
  int sl;
  size_t i;
  vector<long,_std::allocator<long>_> values;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffff70;
  long local_60;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffffb0;
  ulong uVar6;
  ulong __n;
  int in_stack_ffffffffffffffbc;
  Int64Option *in_stack_ffffffffffffffc0;
  vector<long,_std::allocator<long>_> local_38;
  vector<long,_std::allocator<long>_> *local_20;
  char *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  if (in_ESI == 0) {
    if ((*(long *)(in_RDI + 0x38) - *(long *)(in_RDI + 0x30) < 0x11) &&
       (1 < *(long *)(in_RDI + 0x38) - *(long *)(in_RDI + 0x30))) {
      for (local_60 = *(long *)(in_RDI + 0x30); local_60 <= *(long *)(in_RDI + 0x38);
          local_60 = local_60 + 1) {
        if (local_60 != *(long *)(in_RDI + 0x48)) {
          snprintf(local_18,(size_t)local_20,"%ld",local_60);
          sVar5 = strlen(local_18);
          pvVar1 = local_20;
          iVar2 = (int)sVar5;
          sVar5 = strlen(local_18);
          local_20 = (vector<long,_std::allocator<long>_> *)((long)pvVar1 + (-1 - sVar5));
          if ((local_60 != *(long *)(in_RDI + 0x38)) && (local_60 + 1 != *(long *)(in_RDI + 0x48)))
          {
            local_18[iVar2] = ',';
            local_18[iVar2 + 1] = '\0';
            local_18 = local_18 + (iVar2 + 1);
          }
        }
      }
    }
  }
  else {
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)0x14b9f0);
    fillGranularityDomain
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0);
    uVar6 = 0;
    while (__n = uVar6, sVar3 = std::vector<long,_std::allocator<long>_>::size(&local_38),
          uVar6 < sVar3) {
      pvVar4 = std::vector<long,_std::allocator<long>_>::operator[](&local_38,__n);
      __s = local_18;
      pvVar1 = local_20;
      if (*pvVar4 != *(long *)(in_RDI + 0x48)) {
        pvVar4 = std::vector<long,_std::allocator<long>_>::operator[](&local_38,__n);
        snprintf(__s,(size_t)pvVar1,"%ld",*pvVar4);
        sVar5 = strlen(local_18);
        iVar2 = (int)sVar5;
        sVar5 = strlen(local_18);
        uVar6 = __n + 1;
        in_stack_ffffffffffffff70 = local_20;
        local_20 = (vector<long,_std::allocator<long>_> *)((long)local_20 + (-1 - sVar5));
        sVar3 = std::vector<long,_std::allocator<long>_>::size(&local_38);
        if ((uVar6 < sVar3) &&
           (pvVar4 = std::vector<long,_std::allocator<long>_>::operator[](&local_38,__n + 1),
           *pvVar4 != *(long *)(in_RDI + 0x48))) {
          local_18[iVar2] = ',';
          local_18[iVar2 + 1] = '\0';
          local_18 = local_18 + (iVar2 + 1);
        }
      }
      uVar6 = __n + 1;
    }
    std::vector<long,_std::allocator<long>_>::~vector(in_stack_ffffffffffffff70);
  }
  return;
}

Assistant:

virtual void getNonDefaultString(int granularity, char *buffer, size_t size)
    {
        if (granularity != 0) {
            std::vector<int64_t> values;
            fillGranularityDomain(granularity, values);
            for (size_t i = 0; i < values.size(); ++i) {
                if (values[i] == defaultValue) {
                    continue;
                }                                         // do not print default value
                snprintf(buffer, size, "%ld", values[i]); // convert value
                const int sl = strlen(buffer);
                size = size - strlen(buffer) - 1; // store new size
                if (i + 1 < values.size() && values[i + 1] != defaultValue) {
                    buffer[sl] = ',';           // set separator
                    buffer[sl + 1] = 0;         // indicate end of buffer
                    buffer = &(buffer[sl + 1]); // move start pointer accordingly (len is one more now)
                }
            }
        } else if (range.end - range.begin <= 16 && range.end - range.begin > 1) {
            for (int64_t i = range.begin; i <= range.end; ++i) {
                if (i == defaultValue) {
                    continue;
                }                                 // do not print default value
                snprintf(buffer, size, "%ld", i); // convert value
                const int sl = strlen(buffer);
                size = size - strlen(buffer) - 1; // store new size
                if (i != range.end && i + 1 != defaultValue) {
                    buffer[sl] = ',';           // set separator
                    buffer[sl + 1] = 0;         // indicate end of buffer
                    buffer = &(buffer[sl + 1]); // move start pointer accordingly (len is one more now)
                }
            }
        }
    }